

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.h
# Opt level: O1

void __thiscall Assimp::NFFImporter::MeshInfo::MeshInfo(MeshInfo *this,MeshInfo *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined2 uVar5;
  float fVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  (this->shader).color.r = (param_1->shader).color.r;
  (this->shader).color.g = (param_1->shader).color.g;
  (this->shader).color.b = (param_1->shader).color.b;
  (this->shader).diffuse.r = (param_1->shader).diffuse.r;
  (this->shader).diffuse.g = (param_1->shader).diffuse.g;
  (this->shader).diffuse.b = (param_1->shader).diffuse.b;
  (this->shader).specular.r = (param_1->shader).specular.r;
  (this->shader).specular.g = (param_1->shader).specular.g;
  (this->shader).specular.b = (param_1->shader).specular.b;
  (this->shader).ambient.r = (param_1->shader).ambient.r;
  (this->shader).ambient.g = (param_1->shader).ambient.g;
  (this->shader).ambient.b = (param_1->shader).ambient.b;
  (this->shader).emissive.r = (param_1->shader).emissive.r;
  (this->shader).emissive.g = (param_1->shader).emissive.g;
  (this->shader).emissive.b = (param_1->shader).emissive.b;
  (this->shader).refracti = (param_1->shader).refracti;
  paVar1 = &(this->shader).texFile.field_2;
  (this->shader).texFile._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->shader).texFile._M_dataplus._M_p;
  paVar7 = &(param_1->shader).texFile.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&(param_1->shader).texFile.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->shader).texFile.field_2 + 8) = uVar3;
  }
  else {
    (this->shader).texFile._M_dataplus._M_p = pcVar2;
    (this->shader).texFile.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->shader).texFile._M_string_length = (param_1->shader).texFile._M_string_length;
  (param_1->shader).texFile._M_dataplus._M_p = (pointer)paVar7;
  (param_1->shader).texFile._M_string_length = 0;
  (param_1->shader).texFile.field_2._M_local_buf[0] = '\0';
  (this->shader).shininess = (param_1->shader).shininess;
  bVar4 = (param_1->shader).shaded;
  uVar5 = *(undefined2 *)&(param_1->shader).field_0x62;
  fVar6 = (param_1->shader).opacity;
  (this->shader).twoSided = (param_1->shader).twoSided;
  (this->shader).shaded = bVar4;
  *(undefined2 *)&(this->shader).field_0x62 = uVar5;
  (this->shader).opacity = fVar6;
  paVar1 = &(this->shader).name.field_2;
  (this->shader).name._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->shader).name._M_dataplus._M_p;
  paVar7 = &(param_1->shader).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&(param_1->shader).name.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->shader).name.field_2 + 8) = uVar3;
  }
  else {
    (this->shader).name._M_dataplus._M_p = pcVar2;
    (this->shader).name.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->shader).name._M_string_length = (param_1->shader).name._M_string_length;
  (param_1->shader).name._M_dataplus._M_p = (pointer)paVar7;
  (param_1->shader).name._M_string_length = 0;
  (param_1->shader).name.field_2._M_local_buf[0] = '\0';
  (this->shader).mapping = (param_1->shader).mapping;
  memcpy(&this->pType,&param_1->pType,0xac);
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->vertices).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->vertices).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->vertices).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  this->matIndex = param_1->matIndex;
  return;
}

Assistant:

MeshInfo(PatchType _pType, bool bL = false)
            : pType     (_pType)
            , bLocked   (bL)
            , radius    (1.f,1.f,1.f)
            , dir       (0.f,1.f,0.f)
            , matIndex  (0)
        {
            name[0] = '\0'; // by default meshes are unnamed
        }